

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

void trb_print_entire_node
               (trt_node *node,uint32_t max_gap_before_type,trt_wrapper wr,trt_printer_ctx *pc,
               trt_tree_ctx *tc)

{
  ly_bool lVar1;
  trt_type_type tVar2;
  trt_iffeatures_type tVar3;
  char *__s;
  ly_out *out;
  size_t mll;
  char *pcVar4;
  _func_void_trt_tree_ctx_ptr_ly_out_ptr *p_Var5;
  _func_void_trt_tree_ctx_ptr_ly_out_ptr *p_Var6;
  trt_pck_print pck;
  trt_pck_print pck_00;
  trt_pck_print pck_01;
  trt_wrapper tVar7;
  trt_pck_print ppck;
  trt_pck_indent indent;
  trt_pck_indent indent_00;
  uint32_t uVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  trt_node *ptVar13;
  trt_node *ptVar14;
  trt_node *ptVar15;
  trt_pck_indent *__return_storage_ptr__;
  byte bVar16;
  trt_node node_1;
  trt_pair_indent_node local_188;
  trt_pck_indent local_118;
  trt_wrapper local_e8;
  ulong uStack_d0;
  ushort local_c8;
  undefined2 uStack_c6;
  undefined4 uStack_c4;
  trt_node local_b8;
  trt_pck_indent local_58;
  
  tVar7 = wr;
  bVar16 = 0;
  lVar1 = (node->name).keys;
  tVar2 = (node->type).type;
  if (tVar2 == TRD_TYPE_EMPTY) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0x4000000000000;
    pcVar4 = (node->name).add_opts;
    __s = (node->name).opts;
    if (((((node->name).str != (char *)0x0) && (lVar1 == '\0')) &&
        (TRD_NODE_CASE < (node->name).type)) && (pcVar4 != (char *)0x0 || __s != (char *)0x0)) {
      if (pcVar4 == (char *)0x0) {
        sVar10 = 0;
      }
      else {
        sVar10 = strlen(pcVar4);
      }
      if (__s == (char *)0x0) {
        sVar9 = 0;
      }
      else {
        sVar9 = strlen(__s);
      }
      uVar12 = 0x4000000000000 - (sVar9 + sVar10 << 0x30);
      if ((sVar9 + sVar10 & 0xfffffffc) == 0) {
        uVar12 = 0x1000000000000;
      }
    }
  }
  tVar3 = (node->iffeatures).type;
  if (max_gap_before_type == 0 || tVar2 == TRD_TYPE_EMPTY) {
    uVar12 = uVar12 >> 0x30;
  }
  else {
    uVar8 = trb_gap_to_opts(node);
    uVar12 = 1;
    if (uVar8 != 0) {
      uVar12 = (ulong)(max_gap_before_type - uVar8 & 0xffff);
    }
  }
  p_Var5 = (pc->fp).print.print_features_names;
  p_Var6 = (pc->fp).print.print_keys;
  local_e8.actual_pos = wr.actual_pos;
  local_e8._20_4_ = wr._20_4_;
  local_e8.type = wr.type;
  local_e8._4_4_ = wr._4_4_;
  local_e8.bit_marks1 = wr.bit_marks1;
  out = pc->out;
  mll = pc->max_line_length;
  uStack_d0 = (ulong)(lVar1 != '\0') << 0x20 | uVar12 << 0x30;
  local_c8 = (ushort)(tVar3 == TRD_IFF_PRESENT);
  ptVar14 = &local_b8;
  for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
    ptVar14->status = node->status;
    node = (trt_node *)((long)node + (ulong)bVar16 * -0x10 + 8);
    ptVar14 = (trt_node *)((long)ptVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  if (local_b8.type.type == TRD_TYPE_TARGET) {
    pcVar4 = (out->method).fpath.filepath;
    pcVar4[0x10] = '\0';
    pcVar4[0x11] = '\0';
    pcVar4[0x12] = '\0';
    pcVar4[0x13] = '\0';
    pcVar4[0x14] = '\0';
    pcVar4[0x15] = '\0';
    pcVar4[0x16] = '\0';
    pcVar4[0x17] = '\0';
    pcVar4[0] = '\x01';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    trp_print_wrapper(tVar7,out);
    ly_print_(out,"%*c",2,0x20);
    trp_print_divided_node_up_to_name(&local_b8,out);
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    sVar10 = strlen(local_b8.type.str);
    if (mll < sVar10 + *(long *)(pcVar4 + 0x10)) {
      local_b8.type.type = TRD_TYPE_LEAFREF;
    }
  }
  local_188.indent._8_4_ = CONCAT22(uStack_c6,local_c8);
  ptVar14 = &local_188.node;
  local_188.indent.type = (undefined4)uStack_d0;
  local_188.indent.btw_name_opts = uStack_d0._4_2_;
  local_188.indent.btw_opts_type = uStack_d0._6_2_;
  ptVar13 = &local_b8;
  ptVar15 = ptVar14;
  for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
    ptVar15->status = ptVar13->status;
    ptVar13 = (trt_node *)((long)ptVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    ptVar15 = (trt_node *)((long)ptVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  pcVar4 = (out->method).fpath.filepath;
  pcVar4[0x10] = '\0';
  pcVar4[0x11] = '\0';
  pcVar4[0x12] = '\0';
  pcVar4[0x13] = '\0';
  pcVar4[0x14] = '\0';
  pcVar4[0x15] = '\0';
  pcVar4[0x16] = '\0';
  pcVar4[0x17] = '\0';
  pcVar4[0] = '\x01';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pck.fps.print_features_names = p_Var5;
  pck.tree_ctx = tc;
  pck.fps.print_keys = p_Var6;
  trp_try_normal_indent_in_node_(pck,tVar7,mll,(size_t *)(pcVar4 + 0x10),out,&local_188);
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  if (local_188.indent.type == TRD_INDENT_IN_NODE_FAILED) {
    trp_print_wrapper(tVar7,out);
    trp_print_node_up_to_name(&local_b8,out);
    if (((local_b8.iffeatures.type == TRD_IFF_NON_PRESENT) && (local_b8.type.type == TRD_TYPE_EMPTY)
        ) && (local_b8.name.keys == '\0')) {
      return;
    }
    ly_print_(out,"\n");
    ptVar13 = &local_b8;
    ptVar15 = ptVar14;
    for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
      ptVar15->status = ptVar13->status;
      ptVar13 = (trt_node *)((long)ptVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      ptVar15 = (trt_node *)((long)ptVar15 + (ulong)bVar16 * -0x10 + 8);
    }
    if (local_188.indent.btw_name_opts < 0) {
      local_188.indent._0_8_ = (ulong)(local_188.node.type.type != TRD_TYPE_EMPTY) << 0x32;
      local_188.indent.btw_type_iffeatures =
           (ushort)(local_188.node.iffeatures.type != TRD_IFF_NON_PRESENT);
    }
    else if (local_188.indent.btw_opts_type == -1) {
      local_188.indent.type = TRD_INDENT_IN_NODE_NORMAL;
      local_188.indent.btw_name_opts = 0;
      local_188.indent.btw_opts_type = 0;
      local_188.indent.btw_type_iffeatures =
           (ushort)(local_188.node.iffeatures.type != TRD_IFF_NON_PRESENT);
    }
    else if (local_188.indent.btw_type_iffeatures == -1) {
      local_188.node.type.type = TRD_TYPE_EMPTY;
      local_188.node.type.str = (char *)0x0;
      local_188.indent.type = TRD_INDENT_IN_NODE_NORMAL;
      local_188.indent.btw_name_opts = 0;
      local_188.indent.btw_opts_type = 0;
      local_188.indent._8_4_ = (uint)(ushort)local_188.indent._10_2_ << 0x10;
    }
    local_188.indent.type = 1;
    __return_storage_ptr__ = &local_118;
    trp_wrapper_if_last_sibling(&__return_storage_ptr__->wrapper,tVar7,local_b8.last_one);
    local_118.in_node.btw_type_iffeatures = local_188.indent.btw_type_iffeatures;
    local_118.in_node._10_2_ = local_188.indent._10_2_;
    local_118.in_node.type = local_188.indent.type;
    local_118.in_node.btw_name_opts = local_188.indent.btw_name_opts;
    local_118.in_node.btw_opts_type = local_188.indent.btw_opts_type;
    goto LAB_0019d0c6;
  }
  if (local_188.indent.type != TRD_INDENT_IN_NODE_DIVIDED) {
    if (local_188.indent.type != TRD_INDENT_IN_NODE_NORMAL) {
      return;
    }
    indent.in_node._10_2_ = uStack_c6;
    indent.in_node.btw_type_iffeatures = local_c8;
    indent._36_4_ = uStack_c4;
    pck_00.fps.print_features_names = p_Var5;
    pck_00.tree_ctx = tc;
    pck_00.fps.print_keys = p_Var6;
    indent.wrapper.bit_marks1 = local_e8.bit_marks1;
    indent.wrapper.type = local_e8.type;
    indent.wrapper._4_4_ = local_e8._4_4_;
    indent.wrapper.actual_pos = local_e8.actual_pos;
    indent.wrapper._20_4_ = local_e8._20_4_;
    indent.in_node.type = (undefined4)uStack_d0;
    indent.in_node.btw_name_opts = uStack_d0._4_2_;
    indent.in_node.btw_opts_type = uStack_d0._6_2_;
    trp_print_line(&local_b8,pck_00,indent,out);
    return;
  }
  local_118.wrapper.actual_pos = wr.actual_pos;
  local_118.wrapper._20_4_ = wr._20_4_;
  local_118.wrapper.type = wr.type;
  local_118.wrapper._4_4_ = wr._4_4_;
  local_118.wrapper.bit_marks1 = wr.bit_marks1;
  local_118.in_node.btw_type_iffeatures = local_188.indent.btw_type_iffeatures;
  local_118.in_node._10_2_ = local_188.indent._10_2_;
  local_118.in_node._0_8_ = local_188.indent._0_8_ & 0xffffffff00000000;
  pck_01.fps.print_features_names = p_Var5;
  pck_01.tree_ctx = tc;
  pck_01.fps.print_keys = p_Var6;
  indent_00.in_node.type = local_118.in_node.type;
  indent_00.in_node.btw_name_opts = local_118.in_node.btw_name_opts;
  indent_00.in_node.btw_opts_type = local_118.in_node.btw_opts_type;
  indent_00.wrapper = tVar7;
  indent_00.in_node.btw_type_iffeatures = local_188.indent.btw_type_iffeatures;
  indent_00.in_node._10_2_ = local_188.indent._10_2_;
  indent_00._36_4_ = local_118._36_4_;
  trp_print_line(ptVar14,pck_01,indent_00,out);
  ly_print_(out,"\n");
  ptVar13 = &local_b8;
  ptVar15 = ptVar14;
  for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
    ptVar15->status = ptVar13->status;
    ptVar13 = (trt_node *)((long)ptVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    ptVar15 = (trt_node *)((long)ptVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  if (local_188.indent.btw_name_opts < 0) {
    local_188.indent._0_8_ =
         CONCAT26((ushort)(local_188.node.type.type != TRD_TYPE_EMPTY) << 2,local_188.indent._0_6_)
         & 0xffff0000ffffffff;
LAB_0019cfa2:
    local_188.indent.btw_type_iffeatures =
         (ushort)(local_188.node.iffeatures.type != TRD_IFF_NON_PRESENT);
  }
  else {
    if (local_188.indent.btw_opts_type == -1) {
      local_188.indent._0_8_ = local_188.indent._0_8_ & 0xffffffff;
      goto LAB_0019cfa2;
    }
    if (local_188.indent.btw_type_iffeatures == -1) {
      local_188.node.type.type = TRD_TYPE_EMPTY;
      local_188.node.type.str = (char *)0x0;
      local_188.indent._0_8_ = local_188.indent._0_8_ & 0xffffffff;
      local_188.indent._8_4_ = (uint)(ushort)local_188.indent._10_2_ << 0x10;
    }
  }
  __return_storage_ptr__ = &local_58;
  tVar7.bit_marks1 = local_e8.bit_marks1;
  tVar7.type = local_e8.type;
  tVar7._4_4_ = local_e8._4_4_;
  tVar7.actual_pos = local_e8.actual_pos;
  tVar7._20_4_ = local_e8._20_4_;
  trp_wrapper_if_last_sibling(&__return_storage_ptr__->wrapper,tVar7,local_b8.last_one);
  local_58.in_node.type = local_188.indent.type;
  local_58.in_node.btw_name_opts = local_188.indent.btw_name_opts;
  local_58.in_node.btw_opts_type = local_188.indent.btw_opts_type;
  local_58.in_node.btw_type_iffeatures = local_188.indent.btw_type_iffeatures;
  local_58.in_node._10_2_ = local_188.indent._10_2_;
  local_118.wrapper.type = local_58.wrapper.type;
  local_118.wrapper._4_4_ = local_58.wrapper._4_4_;
  local_118.wrapper.bit_marks1 = local_58.wrapper.bit_marks1;
  local_118.wrapper.actual_pos = local_58.wrapper.actual_pos;
  local_118.wrapper._20_4_ = local_58.wrapper._20_4_;
  local_118.in_node.type = local_188.indent.type;
  local_118.in_node.btw_name_opts = local_188.indent.btw_name_opts;
  local_118.in_node.btw_opts_type = local_188.indent.btw_opts_type;
  local_118.in_node.btw_type_iffeatures = local_188.indent.btw_type_iffeatures;
  local_118.in_node._10_2_ = local_188.indent._10_2_;
  local_118._36_4_ = local_58._36_4_;
LAB_0019d0c6:
  ppck.fps.print_features_names = p_Var5;
  ppck.tree_ctx = tc;
  ppck.fps.print_keys = p_Var6;
  local_118.in_node._0_8_ = local_188.indent._0_8_;
  trp_print_divided_node(ptVar14,ppck,*__return_storage_ptr__,mll,out);
  return;
}

Assistant:

static void
trb_print_entire_node(const struct trt_node *node, uint32_t max_gap_before_type, struct trt_wrapper wr,
        struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_indent_in_node ind = trp_default_indent_in_node(node);

    if ((max_gap_before_type > 0) && (node->type.type != TRD_TYPE_EMPTY)) {
        /* print actual node with unified indent */
        ind.btw_opts_type = trb_calc_btw_opts_type(node, max_gap_before_type);
    }
    /* after -> print actual node with default indent */
    trp_print_entire_node(node, TRP_INIT_PCK_PRINT(tc, pc->fp.print),
            TRP_INIT_PCK_INDENT(wr, ind), pc->max_line_length, pc->out);
}